

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O3

bool __thiscall w3Module::read_mutable(w3Module *this,uint8_t **cursor)

{
  byte bVar1;
  string local_38;
  
  bVar1 = ::read_byte(cursor,this->end);
  if (1 < bVar1) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"invalid mutable","");
    ThrowString(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1 == 1;
}

Assistant:

bool w3Module::read_mutable (uint8_t** cursor)
{
    const uint32_t m = read_byte (cursor);
    switch (m)
    {
    case 0:
    case 1: break;
    default:
        ThrowString ("invalid mutable");
    }
    return m == 1;
}